

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall rcg::Stream::startStreaming(Stream *this,int nacquire,int min_buffers)

{
  bool bVar1;
  int iVar2;
  GC_ERROR GVar3;
  undefined8 uVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long *puVar6;
  element_type *peVar7;
  ICommand *pIVar8;
  undefined4 extraout_var_01;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  IInteger *pi;
  BUFFER_HANDLE pp_2;
  CCommandPtr start;
  uint64_t n;
  BUFFER_HANDLE pp_1;
  size_t i;
  bool err;
  IInteger *pp;
  size_t size;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_000002b0;
  string *in_stack_000002b8;
  GenTLException *in_stack_000002c0;
  IInteger *p;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffc98;
  lock_guard<std::recursive_mutex> *in_stack_fffffffffffffca0;
  allocator *paVar9;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  Stream *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  Stream *in_stack_fffffffffffffcc0;
  long *local_338;
  void *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  long *in_stack_fffffffffffffd40;
  Device *in_stack_fffffffffffffd48;
  long *local_2b0;
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *in_stack_fffffffffffffd60;
  long *local_270;
  allocator local_239;
  string local_238 [32];
  gcstring local_218 [24];
  Stream *in_stack_fffffffffffffe00;
  BUFFER_HANDLE local_1c0;
  gcstring local_1b8 [96];
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> local_158;
  uint64_t local_148;
  BUFFER_HANDLE local_140;
  ulong local_138;
  size_t local_130;
  unsigned_long local_128;
  byte local_119;
  gcstring local_118 [80];
  long *local_c8;
  size_t local_c0;
  gcstring local_b8 [80];
  long *local_68;
  undefined1 local_4a;
  allocator local_49;
  string local_48 [56];
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  Buffer::setHandle((Buffer *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                    in_stack_fffffffffffffcd8);
  if (*(long *)(in_RDI + 0xd0) == 0) {
    local_4a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Stream::startStreaming(): Stream is not open",&local_49);
    GenTLException::GenTLException
              ((GenTLException *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_4a = 0;
    __cxa_throw(uVar4,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  local_2b0 = in_stack_fffffffffffffd40;
  if (*(long *)(in_RDI + 0xe0) != 0) {
    stopStreaming(in_stack_fffffffffffffe00);
    local_2b0 = in_stack_fffffffffffffd40;
  }
  std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1203f9)
  ;
  Device::getRemoteNodeMap(in_stack_fffffffffffffd48,(char *)local_2b0);
  peVar5 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12041c);
  GenICam_3_4::gcstring::gcstring(local_b8,"TLParamsLocked");
  iVar2 = (*(peVar5->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar5,local_b8);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_270 = (long *)0x0;
  }
  else {
    local_270 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar2),&GenApi_3_4::INode::typeinfo,
                                       &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
  }
  GenICam_3_4::gcstring::~gcstring(local_b8);
  local_68 = local_270;
  bVar1 = GenApi_3_4::IsWritable((IBase *)in_stack_fffffffffffffca0);
  if (bVar1) {
    (**(code **)(*local_68 + 0x38))(local_68,1,1);
  }
  local_c0 = 0;
  bVar1 = getDefinesPayloadsize(in_stack_fffffffffffffcb0);
  if (bVar1) {
    local_c0 = getPayloadSize(in_stack_fffffffffffffcc0);
  }
  else {
    in_stack_fffffffffffffd60 =
         (CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *)
         std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1205f0);
    GenICam_3_4::gcstring::gcstring(local_118,"PayloadSize");
    iVar2 = (*(((CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *)
               &in_stack_fffffffffffffd60->_vptr_CPointer)->super_CGeneric_XMLLoaderParams).
              _vptr_CGeneric_XMLLoaderParams[7])(in_stack_fffffffffffffd60,local_118);
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      local_2b0 = (long *)0x0;
    }
    else {
      local_2b0 = (long *)__dynamic_cast(CONCAT44(extraout_var_00,iVar2),
                                         &GenApi_3_4::INode::typeinfo,
                                         &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    }
    GenICam_3_4::gcstring::~gcstring(local_118);
    local_c8 = local_2b0;
    in_stack_fffffffffffffd48 = (Device *)0x0;
    if (local_2b0 != (long *)0x0) {
      in_stack_fffffffffffffd48 = (Device *)((long)local_2b0 + *(long *)(*local_2b0 + -0x28));
    }
    bVar1 = GenApi_3_4::IsReadable((IBase *)in_stack_fffffffffffffca0);
    if (bVar1) {
      local_c0 = (**(code **)(*local_c8 + 0x48))(local_c8,0);
    }
  }
  local_119 = 0;
  local_128 = (unsigned_long)local_10;
  local_130 = getBufAnnounceMin(in_stack_fffffffffffffcc0);
  puVar6 = std::max<unsigned_long>(&local_128,&local_130);
  *(unsigned_long *)(in_RDI + 0xe0) = *puVar6;
  local_138 = 0;
  do {
    if (*(ulong *)(in_RDI + 0xe0) <= local_138) {
LAB_001208c7:
      if ((local_119 & 1) == 0) {
        peVar7 = std::
                 __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1208e2);
        GVar3 = (*peVar7->GCRegisterEvent)
                          (*(EVENTSRC_HANDLE *)(in_RDI + 0xd0),1,(EVENT_HANDLE *)(in_RDI + 0xd8));
        if (GVar3 != 0) {
          local_119 = 1;
        }
      }
      local_148 = 0xffffffffffffffff;
      if (0 < local_c) {
        local_148 = (uint64_t)local_c;
      }
      if ((local_119 & 1) == 0) {
        peVar7 = std::
                 __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12095b);
        GVar3 = (*peVar7->DSStartAcquisition)(*(DS_HANDLE *)(in_RDI + 0xd0),0,local_148);
        if (GVar3 != 0) {
          peVar7 = std::
                   __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x12099d);
          (*peVar7->GCUnregisterEvent)(*(EVENTSRC_HANDLE *)(in_RDI + 0xd0),1);
          local_119 = 1;
        }
      }
      if ((local_119 & 1) == 0) {
        std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1209e0);
        Device::getRemoteNodeMap(in_stack_fffffffffffffd48,(char *)local_2b0);
        peVar5 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x120a03);
        GenICam_3_4::gcstring::gcstring(local_1b8,"AcquisitionStart");
        (*(peVar5->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
          super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar5,local_1b8);
        GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::CPointer
                  ((CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *)in_stack_fffffffffffffcb0,
                   (IBase *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        GenICam_3_4::gcstring::~gcstring(local_1b8);
        std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x120a8c);
        pIVar8 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
                           (in_stack_fffffffffffffd60);
        (**(code **)(*(long *)pIVar8 + 0x38))(pIVar8,1);
        GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::~CPointer(&local_158);
      }
      if ((local_119 & 1) != 0) {
        peVar7 = std::
                 __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x120b52);
        (*peVar7->DSFlushQueue)(*(DS_HANDLE *)(in_RDI + 0xd0),4);
        local_1c0 = (BUFFER_HANDLE)0x0;
        while( true ) {
          peVar7 = std::
                   __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120b8e);
          GVar3 = (*peVar7->DSGetBufferID)(*(DS_HANDLE *)(in_RDI + 0xd0),0,&local_1c0);
          if (GVar3 != 0) break;
          peVar7 = std::
                   __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120bd0);
          (*peVar7->DSRevokeBuffer)
                    (*(DS_HANDLE *)(in_RDI + 0xd0),local_1c0,(void **)0x0,(void **)0x0);
        }
        peVar5 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x120c06);
        GenICam_3_4::gcstring::gcstring(local_218,"TLParamsLocked");
        iVar2 = (*(peVar5->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
                  super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])
                          (peVar5,local_218);
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          local_338 = (long *)0x0;
        }
        else {
          local_338 = (long *)__dynamic_cast(CONCAT44(extraout_var_01,iVar2),
                                             &GenApi_3_4::INode::typeinfo,
                                             &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
        }
        GenICam_3_4::gcstring::~gcstring(local_218);
        bVar1 = GenApi_3_4::IsWritable((IBase *)in_stack_fffffffffffffca0);
        if (bVar1) {
          (**(code **)(*local_338 + 0x38))(local_338,0,1);
        }
        uVar4 = __cxa_allocate_exception(0x28);
        paVar9 = &local_239;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_238,"Stream::startStreaming()",paVar9);
        GenTLException::GenTLException(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
        __cxa_throw(uVar4,&GenTLException::typeinfo,GenTLException::~GenTLException);
      }
      std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x120e13);
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x120e20);
      return;
    }
    local_140 = (BUFFER_HANDLE)0x0;
    peVar7 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x120813);
    GVar3 = (*peVar7->DSAllocAndAnnounceBuffer)
                      (*(DS_HANDLE *)(in_RDI + 0xd0),local_c0,(void *)0x0,&local_140);
    if (GVar3 != 0) {
      local_119 = 1;
      goto LAB_001208c7;
    }
    if ((local_119 & 1) == 0) {
      peVar7 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x120873);
      GVar3 = (*peVar7->DSQueueBuffer)(*(DS_HANDLE *)(in_RDI + 0xd0),local_140);
      if (GVar3 != 0) {
        local_119 = 1;
        goto LAB_001208c7;
      }
    }
    local_138 = local_138 + 1;
  } while( true );
}

Assistant:

void Stream::startStreaming(int nacquire, int min_buffers)
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  buffer.setHandle(0);

  if (stream == 0)
  {
    throw GenTLException("Stream::startStreaming(): Stream is not open");
  }

  // stop streaming if it is currently running

  if (bn > 0)
  {
    stopStreaming();
  }

  // lock parameters before streaming starts

  std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
  GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

  if (GenApi::IsWritable(p))
  {
    p->SetValue(1);
  }

  // determine maximum buffer size from transport layer or remote device

  size_t size=0;
  if (getDefinesPayloadsize())
  {
    size=getPayloadSize();
  }
  else
  {
    GenApi::IInteger *pp=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("PayloadSize"));

    if (GenApi::IsReadable(pp))
    {
      size=static_cast<size_t>(pp->GetValue());
    }
  }

  // announce and queue the minimum number of buffers

  bool err=false;

  bn=std::max(static_cast<size_t>(min_buffers), getBufAnnounceMin());
  for (size_t i=0; i<bn; i++)
  {
    GenTL::BUFFER_HANDLE pp=0;

    if (gentl->DSAllocAndAnnounceBuffer(stream, size, 0, &pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }

    if (!err && gentl->DSQueueBuffer(stream, pp) != GenTL::GC_ERR_SUCCESS)
    {
      err=true;
      break;
    }
  }

  // register event

  if (!err && gentl->GCRegisterEvent(stream, GenTL::EVENT_NEW_BUFFER, &event) !=
      GenTL::GC_ERR_SUCCESS)
  {
    err=true;
  }

  // start streaming

  uint64_t n=GENTL_INFINITE;

  if (nacquire > 0)
  {
    n=static_cast<uint64_t>(nacquire);
  }

  if (!err && gentl->DSStartAcquisition(stream, GenTL::ACQ_START_FLAGS_DEFAULT, n) !=
      GenTL::GC_ERR_SUCCESS)
  {
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    err=true;
  }

  if (!err)
  {
    GenApi::CCommandPtr start=parent->getRemoteNodeMap()->_GetNode("AcquisitionStart");
    start->Execute();
  }

  // revoke buffers in case of an error, before throwing an event

  if (err)
  {
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    GenTL::BUFFER_HANDLE pp=0;
    while (gentl->DSGetBufferID(stream, 0, &pp) == GenTL::GC_ERR_SUCCESS)
    {
      gentl->DSRevokeBuffer(stream, pp, 0, 0);
    }

    // unlock parameters

    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }

    throw GenTLException("Stream::startStreaming()", gentl);
  }
}